

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QFontVariableAxis>::reallocateAndGrow
          (QArrayDataPointer<QFontVariableAxis> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QFontVariableAxis> *old)

{
  QFontVariableAxis *pQVar1;
  QArrayData *pQVar2;
  QFontVariableAxisPrivate *pQVar3;
  Data *pDVar4;
  QFontVariableAxis *pQVar5;
  bool bVar6;
  long lVar7;
  qsizetype qVar8;
  QFontVariableAxis *axis;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QArrayDataPointer<QFontVariableAxis> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QFontVariableAxis> *)0x0 && where == GrowsAtEnd) {
    pQVar2 = &this->d->super_QArrayData;
    if (pQVar2 == (QArrayData *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar6)) {
      if (pQVar2 == (QArrayData *)0x0) {
        qVar8 = 0;
        lVar7 = 0;
      }
      else {
        qVar8 = pQVar2->alloc;
        lVar7 = (this->size - pQVar2->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3);
      }
      auVar9 = QArrayData::reallocateUnaligned(pQVar2,this->ptr,8,qVar8 + n + lVar7,Grow);
      this->d = (Data *)auVar9._0_8_;
      this->ptr = (QFontVariableAxis *)auVar9._8_8_;
      goto LAB_00607697;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QFontVariableAxis *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  pQVar5 = local_48.ptr;
  if (this->size != 0) {
    lVar7 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    axis = this->ptr;
    pQVar1 = axis + lVar7;
    if ((old != (QArrayDataPointer<QFontVariableAxis> *)0x0) || (bVar6)) {
      if ((lVar7 != 0) && (0 < lVar7)) {
        do {
          QFontVariableAxis::QFontVariableAxis(pQVar5 + local_48.size,axis);
          axis = axis + 1;
          local_48.size = local_48.size + 1;
        } while (axis < pQVar1);
      }
    }
    else if ((lVar7 != 0) && (0 < lVar7)) {
      do {
        pQVar3 = (axis->d_ptr).d.ptr;
        (axis->d_ptr).d.ptr = (QFontVariableAxisPrivate *)0x0;
        local_48.ptr[local_48.size].d_ptr.d.ptr = pQVar3;
        axis = axis + 1;
        local_48.size = local_48.size + 1;
      } while (axis < pQVar1);
    }
  }
  pDVar4 = this->d;
  pQVar5 = this->ptr;
  this->d = local_48.d;
  this->ptr = local_48.ptr;
  qVar8 = this->size;
  this->size = local_48.size;
  local_48.d = pDVar4;
  local_48.ptr = pQVar5;
  local_48.size = qVar8;
  if (old != (QArrayDataPointer<QFontVariableAxis> *)0x0) {
    local_48.d = old->d;
    local_48.ptr = old->ptr;
    old->d = pDVar4;
    old->ptr = pQVar5;
    local_48.size = old->size;
    old->size = qVar8;
  }
  ~QArrayDataPointer(&local_48);
LAB_00607697:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }